

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O2

bool flow::transform::foldConstantCondBr(IRHandler *handler)

{
  BasicBlock *this;
  long *plVar1;
  _func_int **pp_Var2;
  TerminateInstr *pTVar3;
  long lVar4;
  _List_node_base *p_Var5;
  pointer *__ptr;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *plVar6;
  _Head_base<0UL,_flow::Instr_*,_false> local_58;
  _Head_base<0UL,_flow::Instr_*,_false> local_50;
  _func_int **local_48;
  long local_40;
  _Alloc_hider local_38;
  
  plVar6 = &handler->blocks_;
  p_Var5 = (_List_node_base *)plVar6;
  do {
    do {
      do {
        do {
          p_Var5 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                      *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var5 == (_List_node_base *)plVar6) goto LAB_0014a6fb;
          this = (BasicBlock *)p_Var5[1]._M_next;
          pTVar3 = BasicBlock::getTerminator(this);
        } while (pTVar3 == (TerminateInstr *)0x0);
        lVar4 = __dynamic_cast(pTVar3,&TerminateInstr::typeinfo,&CondBrInstr::typeinfo,0);
      } while (lVar4 == 0);
      plVar1 = *(long **)(lVar4 + 0x50);
    } while (*plVar1 == 0);
    lVar4 = __dynamic_cast(*plVar1,&Value::typeinfo,
                           &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
  } while (lVar4 == 0);
  local_38._M_p = (pointer)plVar1[(ulong)*(byte *)(lVar4 + 0x48) + 1];
  local_40 = plVar1[(ulong)(*(byte *)(lVar4 + 0x48) ^ 1) + 1];
  BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffb8,(char *)this);
  pp_Var2 = local_48;
  local_48 = (_func_int **)0x0;
  if (pp_Var2 != (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 8))();
  }
  std::make_unique<flow::BrInstr,flow::BasicBlock*&>((BasicBlock **)&local_58);
  local_50._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (Instr *)0x0;
  BasicBlock::push_back
            (this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_50);
  if (local_50._M_head_impl != (Instr *)0x0) {
    (*((local_50._M_head_impl)->super_Value)._vptr_Value[1])();
  }
  local_50._M_head_impl = (Instr *)0x0;
  if (local_58._M_head_impl != (Instr *)0x0) {
    (*((local_58._M_head_impl)->super_Value)._vptr_Value[1])();
  }
  if (local_48 != (_func_int **)0x0) {
    (**(code **)(*local_48 + 8))();
  }
LAB_0014a6fb:
  return p_Var5 != (_List_node_base *)plVar6;
}

Assistant:

bool foldConstantCondBr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    if (auto condbr = dynamic_cast<CondBrInstr*>(bb->getTerminator())) {
      if (auto cond = dynamic_cast<ConstantBoolean*>(condbr->condition())) {
        // FLOW_TRACE("flow: rewrite condbr %{} with constant expression %{}", condbr->name(), cond->name());
        std::pair<BasicBlock*, BasicBlock*> use;

        if (cond->get()) {
          // FLOW_TRACE("if-condition is always true");
          use = std::make_pair(condbr->trueBlock(), condbr->falseBlock());
        } else {
          // FLOW_TRACE("if-condition is always false");
          use = std::make_pair(condbr->falseBlock(), condbr->trueBlock());
        }

        auto x = bb->remove(condbr);
        x.reset(nullptr);
        bb->push_back(std::make_unique<BrInstr>(use.first));
        return true;
      }
    }
  }

  return false;
}